

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_shrink(mbedtls_mpi *X,size_t nblimbs)

{
  ulong uVar1;
  mbedtls_mpi_uint *__src;
  ulong uVar2;
  int iVar3;
  mbedtls_mpi_uint *__dest;
  ulong uVar4;
  
  uVar1 = X->n;
  uVar2 = uVar1;
  if (uVar1 <= nblimbs) {
    iVar3 = mbedtls_mpi_grow(X,nblimbs);
    return iVar3;
  }
  do {
    uVar4 = uVar2;
    if (uVar4 == 1) break;
    uVar2 = uVar4 - 1;
  } while (X->p[uVar4 - 1] == 0);
  if (nblimbs < uVar4) {
    nblimbs = uVar4;
  }
  __dest = (mbedtls_mpi_uint *)calloc(nblimbs,8);
  if (__dest == (mbedtls_mpi_uint *)0x0) {
    iVar3 = -0x10;
  }
  else {
    __src = X->p;
    if (__src != (mbedtls_mpi_uint *)0x0) {
      memcpy(__dest,__src,nblimbs * 8);
      mbedtls_zeroize(__src,uVar1 << 3);
      free(X->p);
    }
    X->n = nblimbs;
    X->p = __dest;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_shrink( mbedtls_mpi *X, size_t nblimbs )
{
    mbedtls_mpi_uint *p;
    size_t i;

    /* Actually resize up in this case */
    if( X->n <= nblimbs )
        return( mbedtls_mpi_grow( X, nblimbs ) );

    for( i = X->n - 1; i > 0; i-- )
        if( X->p[i] != 0 )
            break;
    i++;

    if( i < nblimbs )
        i = nblimbs;

    if( ( p = mbedtls_calloc( i, ciL ) ) == NULL )
        return( MBEDTLS_ERR_MPI_ALLOC_FAILED );

    if( X->p != NULL )
    {
        memcpy( p, X->p, i * ciL );
        mbedtls_zeroize( X->p, X->n * ciL );
        mbedtls_free( X->p );
    }

    X->n = i;
    X->p = p;

    return( 0 );
}